

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::walletprocesspsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffee08;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffee10;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffee18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee20;
  string *in_stack_ffffffffffffee38;
  string *in_stack_ffffffffffffee40;
  UniValue *in_stack_ffffffffffffee48;
  UniValue *in_stack_ffffffffffffee50;
  undefined7 in_stack_ffffffffffffee58;
  undefined1 in_stack_ffffffffffffee5f;
  string *in_stack_ffffffffffffee60;
  string *in_stack_ffffffffffffee68;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffee70;
  undefined1 *puVar2;
  string *in_stack_ffffffffffffee78;
  RPCArg *in_stack_ffffffffffffee80;
  RPCResult *in_stack_ffffffffffffee88;
  RPCResult *in_stack_ffffffffffffee90;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  allocator<char> local_fcb;
  allocator<char> local_fca [2];
  pointer local_fc8;
  pointer pRStack_fc0;
  pointer local_fb8;
  allocator<char> local_faa;
  allocator<char> local_fa9 [25];
  undefined8 in_stack_fffffffffffff070;
  allocator<char> local_f6a;
  allocator<char> local_f69 [31];
  allocator<char> local_f4a;
  allocator<char> local_f49 [29];
  allocator<char> local_f2c;
  undefined1 local_f2b;
  allocator<char> local_f2a;
  allocator<char> local_f29;
  undefined1 local_f28;
  undefined1 local_f27;
  undefined1 local_f26;
  undefined1 local_f25;
  undefined1 local_f24 [3];
  allocator<char> local_f21;
  undefined4 local_f20;
  allocator<char> local_f19 [32];
  allocator<char> local_ef9 [321];
  undefined1 local_db8 [408];
  undefined1 local_c20 [200];
  undefined1 local_b58;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined1 local_b18;
  undefined1 local_b17;
  undefined1 local_a18;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined1 local_9d8;
  undefined1 local_9d7;
  undefined1 local_8d8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined1 local_898;
  undefined1 local_897;
  undefined1 local_798;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined1 local_758;
  undefined1 local_757;
  undefined1 local_658;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined1 local_617;
  undefined1 local_570 [264];
  RPCHelpMan local_468;
  vector<RPCArg,_std::allocator<RPCArg>_> local_360 [33];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_f20 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee18,&in_stack_ffffffffffffee10->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_658 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee20);
  local_630 = 0;
  uStack_628 = 0;
  local_620 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee08);
  local_618 = 0;
  local_617 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
                 (Type)((ulong)in_stack_ffffffffffffee70 >> 0x20),
                 (Fallback *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58));
  this_01 = &local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_f24[1] = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffee48,(bool *)in_stack_ffffffffffffee40);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  name = (string *)local_f24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_798 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee20);
  local_770 = 0;
  uStack_768 = 0;
  local_760 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee08);
  local_758 = 0;
  local_757 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
                 (Type)((ulong)in_stack_ffffffffffffee70 >> 0x20),
                 (Fallback *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58));
  args = local_360;
  description = (string *)&local_f25;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (in_stack_ffffffffffffee50,(char (*) [35])in_stack_ffffffffffffee48);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  results = (RPCResults *)&local_f26;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_8d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee20);
  local_8b0 = 0;
  uStack_8a8 = 0;
  local_8a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee08);
  local_898 = 0;
  local_897 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
                 (Type)((ulong)in_stack_ffffffffffffee70 >> 0x20),
                 (Fallback *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58));
  examples = (RPCExamples *)&local_f27;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_f28 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffee48,(bool *)in_stack_ffffffffffffee40);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_a18 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee20);
  local_9f0 = 0;
  uStack_9e8 = 0;
  local_9e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee08);
  local_9d8 = 0;
  local_9d7 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
                 (Type)((ulong)in_stack_ffffffffffffee70 >> 0x20),
                 (Fallback *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_f2b = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffee48,(bool *)in_stack_ffffffffffffee40);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_b58 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee20);
  local_b30 = 0;
  uStack_b28 = 0;
  local_b20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee08);
  local_b18 = 0;
  local_b17 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
                 (Type)((ulong)in_stack_ffffffffffffee70 >> 0x20),
                 (Fallback *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffee08);
  __l._M_len._0_7_ = in_stack_ffffffffffffee58;
  __l._M_array = (iterator)in_stack_ffffffffffffee50;
  __l._M_len._7_1_ = in_stack_ffffffffffffee5f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee48,__l,
             (allocator_type *)in_stack_ffffffffffffee40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee08);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee90,(Type)((ulong)in_stack_ffffffffffffee88 >> 0x20),
             &in_stack_ffffffffffffee80->m_names,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70
             ,SUB81((ulong)in_stack_ffffffffffffee68 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_fa9[1] = (allocator<char>)0x0;
  local_fa9[2] = (allocator<char>)0x0;
  local_fa9[3] = (allocator<char>)0x0;
  local_fa9[4] = (allocator<char>)0x0;
  local_fa9[5] = (allocator<char>)0x0;
  local_fa9[6] = (allocator<char>)0x0;
  local_fa9[7] = (allocator<char>)0x0;
  local_fa9[8] = (allocator<char>)0x0;
  local_fa9[9] = (allocator<char>)0x0;
  local_fa9[10] = (allocator<char>)0x0;
  local_fa9[0xb] = (allocator<char>)0x0;
  local_fa9[0xc] = (allocator<char>)0x0;
  local_fa9[0xd] = (allocator<char>)0x0;
  local_fa9[0xe] = (allocator<char>)0x0;
  local_fa9[0xf] = (allocator<char>)0x0;
  local_fa9[0x10] = (allocator<char>)0x0;
  local_fa9[0x11] = (allocator<char>)0x0;
  local_fa9[0x12] = (allocator<char>)0x0;
  local_fa9[0x13] = (allocator<char>)0x0;
  local_fa9[0x14] = (allocator<char>)0x0;
  local_fa9[0x15] = (allocator<char>)0x0;
  local_fa9[0x16] = (allocator<char>)0x0;
  local_fa9[0x17] = (allocator<char>)0x0;
  local_fa9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee08);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee90,(Type)((ulong)in_stack_ffffffffffffee88 >> 0x20),
             &in_stack_ffffffffffffee80->m_names,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70
             ,SUB81((ulong)in_stack_ffffffffffffee68 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  local_fc8 = (pointer)0x0;
  pRStack_fc0 = (pointer)0x0;
  local_fb8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee08);
  this = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffee08 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee88,(Type)((ulong)in_stack_ffffffffffffee80 >> 0x20),
             in_stack_ffffffffffffee78,SUB81((ulong)in_stack_ffffffffffffee70 >> 0x38,0),
             in_stack_ffffffffffffee68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee60,
             (bool)in_stack_ffffffffffffee5f);
  skip_type_check = (undefined1)((ulong)in_stack_ffffffffffffee68 >> 0x38);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffee58;
  __l_00._M_array = (iterator)in_stack_ffffffffffffee50;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffee5f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee48,__l_00,
             (allocator_type *)in_stack_ffffffffffffee40);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee90,(Type)((ulong)in_stack_ffffffffffffee88 >> 0x20),
             &in_stack_ffffffffffffee80->m_names,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70
             ,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_ffffffffffffee88,(RPCResult *)in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee5f,in_stack_ffffffffffffee58),
             (char *)in_stack_ffffffffffffee50,(allocator<char> *)in_stack_ffffffffffffee48);
  HelpExampleCli(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0xca792e);
  this_00 = (RPCArg *)&stack0xfffffffffffff010;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::walletprocesspsbt()::__0,void>
            (in_stack_ffffffffffffee18,(anon_class_1_0_00000001 *)in_stack_ffffffffffffee10);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff070);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_fcb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_fca);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_db8;
  puVar1 = local_c20;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_faa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_fa9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff076);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff077);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f6a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f69);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f4a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f49);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee18);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_570;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f2c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f2a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f29);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_f27);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_f26);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_f25);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f24);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_f24 + 2));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_f21);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_f19);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_ef9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletprocesspsbt()
{
    return RPCHelpMan{"walletprocesspsbt",
                "\nUpdate a PSBT with input information from our wallet and then sign inputs\n"
                "that we can sign for." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction base64 string"},
                    {"sign", RPCArg::Type::BOOL, RPCArg::Default{true}, "Also sign the transaction when updating (requires wallet to be unlocked)"},
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type to sign with if not specified by the PSBT. Must be one of\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\""},
                    {"bip32derivs", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include BIP 32 derivation paths for public keys if we know them"},
                    {"finalize", RPCArg::Type::BOOL, RPCArg::Default{true}, "Also finalize inputs if possible"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", "The base64-encoded partially signed transaction"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The hex-encoded network transaction if complete"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("walletprocesspsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const CWallet& wallet{*pwallet};
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    // Unserialize the transaction
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    // Get the sighash type
    int nHashType = ParseSighashString(request.params[2]);

    // Fill transaction with our data and also sign
    bool sign = request.params[1].isNull() ? true : request.params[1].get_bool();
    bool bip32derivs = request.params[3].isNull() ? true : request.params[3].get_bool();
    bool finalize = request.params[4].isNull() ? true : request.params[4].get_bool();
    bool complete = true;

    if (sign) EnsureWalletIsUnlocked(*pwallet);

    const auto err{wallet.FillPSBT(psbtx, complete, nHashType, sign, bip32derivs, nullptr, finalize)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    UniValue result(UniValue::VOBJ);
    DataStream ssTx{};
    ssTx << psbtx;
    result.pushKV("psbt", EncodeBase64(ssTx.str()));
    result.pushKV("complete", complete);
    if (complete) {
        CMutableTransaction mtx;
        // Returns true if complete, which we already think it is.
        CHECK_NONFATAL(FinalizeAndExtractPSBT(psbtx, mtx));
        DataStream ssTx_final;
        ssTx_final << TX_WITH_WITNESS(mtx);
        result.pushKV("hex", HexStr(ssTx_final));
    }

    return result;
},
    };
}